

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_dirty(_glist *x,t_floatarg f)

{
  uint uVar1;
  _glist *x_00;
  uint n;
  _glist *x2;
  t_floatarg f_local;
  _glist *x_local;
  
  x_00 = canvas_getrootfor(x);
  uVar1 = (uint)(long)f;
  if ((pd_maininstance.pd_gui)->i_reloadingabstraction == (_glist *)0x0) {
    if ((uVar1 != (*(ushort *)&x_00->field_0xe8 >> 2 & 1)) &&
       (*(ushort *)&x_00->field_0xe8 =
             *(ushort *)&x_00->field_0xe8 & 0xfffb | ((ushort)(long)f & 1) << 2,
       (*(ushort *)&x_00->field_0xe8 & 1) != 0)) {
      canvas_reflecttitle(x_00);
    }
    if (uVar1 == 0) {
      canvas_undo_cleardirty(x);
    }
  }
  return;
}

Assistant:

void canvas_dirty(t_canvas *x, t_floatarg f)
{
    t_canvas *x2 = canvas_getrootfor(x);
    unsigned int n = f;
    if (THISGUI->i_reloadingabstraction)
        return;
    if (n != x2->gl_dirty)
    {
        x2->gl_dirty = n;
        if (x2->gl_havewindow)
            canvas_reflecttitle(x2);
    }
    if(!n)
        canvas_undo_cleardirty(x);
}